

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH,int *extra_bits)

{
  int iVar1;
  uint8 *puVar2;
  uint8 uVar3;
  uint8 uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar5 = this->m_bit_buf;
  uVar11 = pH->look_up2[uVar5 >> 0x18];
  if ((int)uVar11 < 0) {
    uVar7 = 0x17;
    iVar8 = 8;
    uVar12 = uVar11;
    do {
      uVar12 = pH->tree[(int)(-(uint)((uVar5 >> (uVar7 & 0x1f) & 1) != 0) - uVar12)];
      uVar7 = uVar7 - 1;
      iVar8 = iVar8 + 1;
    } while ((int)uVar12 < 0);
    if (iVar8 != 0) {
      iVar1 = this->m_bits_left;
      iVar9 = iVar1 - iVar8;
      this->m_bits_left = iVar9;
      if (iVar9 < 1) {
        uVar5 = uVar5 << ((byte)iVar1 & 0x1f);
        this->m_bit_buf = uVar5;
        if (this->m_in_buf_left < 2) {
LAB_00113914:
          uVar3 = get_octet(this);
          uVar4 = get_octet(this);
          this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
        }
        else {
          puVar2 = this->m_pIn_buf_ofs;
          if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_00113914;
          this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
          this->m_in_buf_left = this->m_in_buf_left + -2;
          this->m_pIn_buf_ofs = puVar2 + 2;
        }
        iVar8 = this->m_bits_left;
        this->m_bit_buf = this->m_bit_buf << (-(char)iVar8 & 0x1fU);
        this->m_bits_left = iVar8 + 0x10;
        if (iVar8 < -0x10) goto LAB_00113ce4;
      }
      else {
        this->m_bit_buf = uVar5 << ((byte)iVar8 & 0x1f);
      }
    }
    uVar5 = uVar12 & 0xf;
    if (uVar5 == 0) {
LAB_00113bb0:
      uVar11 = 0;
      goto LAB_00113cb0;
    }
    uVar7 = this->m_bit_buf;
    uVar11 = uVar7 >> (-(sbyte)uVar5 & 0x1fU);
    iVar8 = this->m_bits_left;
    this->m_bits_left = iVar8 - uVar5;
    if (iVar8 - uVar5 != 0 && (int)uVar5 <= iVar8) {
      this->m_bit_buf = uVar7 << (sbyte)uVar5;
      goto LAB_00113cb0;
    }
    uVar7 = uVar7 << ((byte)iVar8 & 0x1f);
    this->m_bit_buf = uVar7;
    if (1 < this->m_in_buf_left) {
      puVar2 = this->m_pIn_buf_ofs;
      if ((*puVar2 != 0xff) && (puVar2[1] != 0xff)) {
        this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar7;
        this->m_in_buf_left = this->m_in_buf_left + -2;
        this->m_pIn_buf_ofs = puVar2 + 2;
        goto LAB_00113c32;
      }
    }
LAB_00113c10:
    uVar3 = get_octet(this);
    uVar4 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
  }
  else {
    uVar7 = uVar11 >> 8 & 0x1f;
    uVar12 = uVar11 & 0xff;
    uVar10 = uVar11 & 0xf;
    if (uVar7 != ((uint)(int)(short)uVar11 >> 0xf & uVar10) + (uint)pH->code_size[uVar12]) {
      __assert_fail("((symbol >> 8) & 31) == pH->code_size[symbol & 255] + ((symbol & 0x8000) ? (symbol & 15) : 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                    ,0x219,"int jpgd::jpeg_decoder::huff_decode(huff_tables *, int &)");
    }
    if ((short)uVar11 < 0) {
      if (uVar7 != 0) {
        iVar8 = this->m_bits_left;
        this->m_bits_left = iVar8 - uVar7;
        if (iVar8 - uVar7 == 0 || iVar8 < (int)uVar7) {
          uVar5 = uVar5 << ((byte)iVar8 & 0x1f);
          this->m_bit_buf = uVar5;
          if (this->m_in_buf_left < 2) {
LAB_00113a03:
            uVar3 = get_octet(this);
            uVar4 = get_octet(this);
            this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
          }
          else {
            puVar2 = this->m_pIn_buf_ofs;
            if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_00113a03;
            this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
            this->m_in_buf_left = this->m_in_buf_left + -2;
            this->m_pIn_buf_ofs = puVar2 + 2;
          }
          iVar8 = this->m_bits_left;
          this->m_bit_buf = this->m_bit_buf << (-(char)iVar8 & 0x1fU);
          this->m_bits_left = iVar8 + 0x10;
          if (iVar8 < -0x10) goto LAB_00113ce4;
        }
        else {
          this->m_bit_buf = uVar5 << (sbyte)uVar7;
        }
      }
      uVar11 = uVar11 >> 0x10;
      goto LAB_00113cb0;
    }
    iVar8 = uVar7 + uVar10;
    iVar1 = this->m_bits_left;
    sVar6 = (sbyte)uVar10;
    if (iVar8 <= iVar1 + 0x10) {
      if (iVar8 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = uVar5 >> (-(byte)iVar8 & 0x1f);
        this->m_bits_left = iVar1 - iVar8;
        if (iVar1 - iVar8 == 0 || iVar1 < iVar8) {
          uVar5 = uVar5 << ((byte)iVar1 & 0x1f);
          this->m_bit_buf = uVar5;
          if (this->m_in_buf_left < 2) {
LAB_00113c58:
            uVar3 = get_octet(this);
            uVar4 = get_octet(this);
            this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
          }
          else {
            puVar2 = this->m_pIn_buf_ofs;
            if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_00113c58;
            this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
            this->m_in_buf_left = this->m_in_buf_left + -2;
            this->m_pIn_buf_ofs = puVar2 + 2;
          }
          iVar8 = this->m_bits_left;
          this->m_bit_buf = this->m_bit_buf << (-(char)iVar8 & 0x1fU);
          this->m_bits_left = iVar8 + 0x10;
          if (iVar8 < -0x10) goto LAB_00113ce4;
        }
        else {
          this->m_bit_buf = uVar5 << ((byte)iVar8 & 0x1f);
        }
      }
      uVar11 = ~(-1 << sVar6) & uVar11;
      goto LAB_00113cb0;
    }
    if (uVar7 != 0) {
      this->m_bits_left = iVar1 - uVar7;
      if (iVar1 - uVar7 == 0 || iVar1 < (int)uVar7) {
        uVar5 = uVar5 << ((byte)iVar1 & 0x1f);
        this->m_bit_buf = uVar5;
        if (this->m_in_buf_left < 2) {
LAB_00113b2c:
          uVar3 = get_octet(this);
          uVar4 = get_octet(this);
          this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar3,uVar4);
        }
        else {
          puVar2 = this->m_pIn_buf_ofs;
          if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_00113b2c;
          this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
          this->m_in_buf_left = this->m_in_buf_left + -2;
          this->m_pIn_buf_ofs = puVar2 + 2;
        }
        iVar8 = this->m_bits_left;
        this->m_bit_buf = this->m_bit_buf << (-(char)iVar8 & 0x1fU);
        this->m_bits_left = iVar8 + 0x10;
        if (iVar8 < -0x10) goto LAB_00113ce4;
      }
      else {
        this->m_bit_buf = uVar5 << (sbyte)uVar7;
      }
    }
    if (uVar10 == 0) goto LAB_00113bb0;
    uVar5 = this->m_bit_buf;
    uVar11 = uVar5 >> (-sVar6 & 0x1fU);
    iVar8 = this->m_bits_left;
    this->m_bits_left = iVar8 - uVar10;
    if (iVar8 - uVar10 != 0 && (int)uVar10 <= iVar8) {
      this->m_bit_buf = uVar5 << sVar6;
      goto LAB_00113cb0;
    }
    uVar5 = uVar5 << ((byte)iVar8 & 0x1f);
    this->m_bit_buf = uVar5;
    if (this->m_in_buf_left < 2) goto LAB_00113c10;
    puVar2 = this->m_pIn_buf_ofs;
    if ((*puVar2 == 0xff) || (puVar2[1] == 0xff)) goto LAB_00113c10;
    this->m_bit_buf = CONCAT11(*puVar2,puVar2[1]) | uVar5;
    this->m_in_buf_left = this->m_in_buf_left + -2;
    this->m_pIn_buf_ofs = puVar2 + 2;
  }
LAB_00113c32:
  iVar8 = this->m_bits_left;
  this->m_bit_buf = this->m_bit_buf << (-(char)iVar8 & 0x1fU);
  this->m_bits_left = iVar8 + 0x10;
  if (iVar8 < -0x10) {
LAB_00113ce4:
    __assert_fail("m_bits_left >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0x1e3,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
  }
LAB_00113cb0:
  *extra_bits = uVar11;
  return uVar12;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables *pH, int& extra_bits)
{
  int symbol;

  // Check first 8-bits: do we have a complete symbol?
  if ((symbol = pH->look_up2[m_bit_buf >> 24]) < 0)
  {
    // Use a tree traversal to find symbol.
    int ofs = 23;
    do
    {
      symbol = pH->tree[-(int)(symbol + ((m_bit_buf >> ofs) & 1))];
      ofs--;
    } while (symbol < 0);

    get_bits_no_markers(8 + (23 - ofs));

    extra_bits = get_bits_no_markers(symbol & 0xF);
  }
  else
  {
    JPGD_ASSERT(((symbol >> 8) & 31) == pH->code_size[symbol & 255] + ((symbol & 0x8000) ? (symbol & 15) : 0));

    if (symbol & 0x8000)
    {
      get_bits_no_markers((symbol >> 8) & 31);
      extra_bits = symbol >> 16;
    }
    else
    {
      int code_size = (symbol >> 8) & 31;
      int num_extra_bits = symbol & 0xF;
      int bits = code_size + num_extra_bits;
      if (bits <= (m_bits_left + 16))
        extra_bits = get_bits_no_markers(bits) & ((1 << num_extra_bits) - 1);
      else
      {
        get_bits_no_markers(code_size);
        extra_bits = get_bits_no_markers(num_extra_bits);
      }
    }

    symbol &= 0xFF;
  }

  return symbol;
}